

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O0

u_char * ngx_sprintf_num(u_char *buf,u_char *last,uint64_t ui64,u_char zero,ngx_uint_t hexadecimal,
                        ngx_uint_t width)

{
  undefined1 auVar1 [16];
  u_char *puVar2;
  uint local_64;
  u_char *puStack_60;
  uint32_t ui32;
  size_t len;
  u_char temp [21];
  u_char *p;
  ngx_uint_t width_local;
  ngx_uint_t hexadecimal_local;
  uint64_t uStack_20;
  u_char zero_local;
  uint64_t ui64_local;
  u_char *last_local;
  u_char *buf_local;
  
  register0x00000000 = temp + 0xc;
  uStack_20 = ui64;
  if (hexadecimal == 0) {
    if (ui64 < 0x100000000) {
      local_64 = (uint)ui64;
      do {
        puVar2 = stack0xffffffffffffffc0 + -1;
        stack0xffffffffffffffc0[-1] = (char)((ulong)local_64 % 10) + '0';
        local_64 = local_64 / 10;
        unique0x1000016d = puVar2;
      } while (local_64 != 0);
    }
    else {
      do {
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uStack_20;
        puVar2 = stack0xffffffffffffffc0 + -1;
        stack0xffffffffffffffc0[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
        uStack_20 = uStack_20 / 10;
        unique0x1000015d = puVar2;
      } while (uStack_20 != 0);
    }
  }
  else if (hexadecimal == 1) {
    do {
      puVar2 = stack0xffffffffffffffc0 + -1;
      stack0xffffffffffffffc0[-1] = ngx_sprintf_num::hex[(uint)uStack_20 & 0xf];
      uStack_20 = uStack_20 >> 4;
      unique0x10000155 = puVar2;
    } while (uStack_20 != 0);
  }
  else {
    do {
      puVar2 = stack0xffffffffffffffc0 + -1;
      stack0xffffffffffffffc0[-1] = ngx_sprintf_num::HEX[(uint)uStack_20 & 0xf];
      uStack_20 = uStack_20 >> 4;
      unique0x1000014d = puVar2;
    } while (uStack_20 != 0);
  }
  puStack_60 = temp + (0xc - (long)stack0xffffffffffffffc0);
  last_local = buf;
  while (puStack_60 < width && last_local < last) {
    *last_local = zero;
    puStack_60 = puStack_60 + 1;
    last_local = last_local + 1;
  }
  puStack_60 = temp + (0xc - (long)stack0xffffffffffffffc0);
  if (last < last_local + (long)puStack_60) {
    puStack_60 = last + -(long)last_local;
  }
  memcpy(last_local,stack0xffffffffffffffc0,(size_t)puStack_60);
  return last_local + (long)puStack_60;
}

Assistant:

static u_char *
ngx_sprintf_num(u_char *buf, u_char *last, uint64_t ui64, u_char zero,
    ngx_uint_t hexadecimal, ngx_uint_t width)
{
    u_char         *p, temp[NGX_INT64_LEN + 1];
                       /*
                        * we need temp[NGX_INT64_LEN] only,
                        * but icc issues the warning
                        */
    size_t          len;
    uint32_t        ui32;
    static u_char   hex[] = "0123456789abcdef";
    static u_char   HEX[] = "0123456789ABCDEF";

    p = temp + NGX_INT64_LEN;

    if (hexadecimal == 0) {

        if (ui64 <= (uint64_t) NGX_MAX_UINT32_VALUE) {

            /*
             * To divide 64-bit numbers and to find remainders
             * on the x86 platform gcc and icc call the libc functions
             * [u]divdi3() and [u]moddi3(), they call another function
             * in its turn.  On FreeBSD it is the qdivrem() function,
             * its source code is about 170 lines of the code.
             * The glibc counterpart is about 150 lines of the code.
             *
             * For 32-bit numbers and some divisors gcc and icc use
             * a inlined multiplication and shifts.  For example,
             * unsigned "i32 / 10" is compiled to
             *
             *     (i32 * 0xCCCCCCCD) >> 35
             */

            ui32 = (uint32_t) ui64;

            do {
                *--p = (u_char) (ui32 % 10 + '0');
            } while (ui32 /= 10);

        } else {
            do {
                *--p = (u_char) (ui64 % 10 + '0');
            } while (ui64 /= 10);
        }

    } else if (hexadecimal == 1) {

        do {

            /* the "(uint32_t)" cast disables the BCC's warning */
            *--p = hex[(uint32_t) (ui64 & 0xf)];

        } while (ui64 >>= 4);

    } else { /* hexadecimal == 2 */

        do {

            /* the "(uint32_t)" cast disables the BCC's warning */
            *--p = HEX[(uint32_t) (ui64 & 0xf)];

        } while (ui64 >>= 4);
    }

    /* zero or space padding */

    len = (temp + NGX_INT64_LEN) - p;

    while (len++ < width && buf < last) {
        *buf++ = zero;
    }

    /* number safe copy */

    len = (temp + NGX_INT64_LEN) - p;

    if (buf + len > last) {
        len = last - buf;
    }

    return ngx_cpymem(buf, p, len);
}